

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::ProducerIPCService::CommitData
          (ProducerIPCService *this,CommitDataRequest *req,DeferredCommitDataResponse *resp)

{
  ProducerEndpoint *pPVar1;
  RemoteProducer *pRVar2;
  _func_void__Any_data_ptr *__tmp_1;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  _Any_data local_38;
  code *local_28;
  
  pRVar2 = GetProducerForCurrentRequest(this);
  if (pRVar2 == (RemoteProducer *)0x0) {
    if ((resp->super_DeferredBase).callback_.super__Function_base._M_manager != (_Manager_type)0x0)
    {
      ipc::DeferredBase::Reject(&resp->super_DeferredBase);
      return;
    }
  }
  else {
    local_68 = (code *)0x0;
    pcStack_60 = (code *)0x0;
    local_78._M_unused._M_object = (DeferredCommitDataResponse *)0x0;
    if ((resp->super_DeferredBase).callback_.super__Function_base._M_manager != (_Manager_type)0x0)
    {
      local_58 = 0;
      uStack_50 = 0;
      local_48 = 0;
      local_68 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:74260:16)>
                 ::_M_manager;
      uStack_40 = 0;
      pcStack_60 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:74260:16)>
                   ::_M_invoke;
      local_78._M_unused._M_object = resp;
    }
    local_78._8_8_ = 0;
    pPVar1 = (pRVar2->service_endpoint)._M_t.
             super___uniq_ptr_impl<perfetto::ProducerEndpoint,_std::default_delete<perfetto::ProducerEndpoint>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::ProducerEndpoint_*,_std::default_delete<perfetto::ProducerEndpoint>_>
             .super__Head_base<0UL,_perfetto::ProducerEndpoint_*,_false>._M_head_impl;
    ::std::function<void_()>::function
              ((function<void_()> *)&local_38,(function<void_()> *)&local_78);
    (*pPVar1->_vptr_ProducerEndpoint[7])(pPVar1,req,&local_38);
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
  }
  return;
}

Assistant:

void ProducerIPCService::CommitData(const protos::gen::CommitDataRequest& req,
                                    DeferredCommitDataResponse resp) {
  RemoteProducer* producer = GetProducerForCurrentRequest();
  if (!producer) {
    PERFETTO_DLOG(
        "Producer invoked CommitData() before InitializeConnection()");
    if (resp.IsBound())
      resp.Reject();
    return;
  }

  // We don't want to send a response if the client didn't attach a callback to
  // the original request. Doing so would generate unnecessary wakeups and
  // context switches.
  std::function<void()> callback;
  if (resp.IsBound()) {
    // Capturing |resp| by reference here speculates on the fact that
    // CommitData() in tracing_service_impl.cc invokes the passed callback
    // inline, without posting it. If that assumption changes this code needs to
    // wrap the response in a shared_ptr (C+11 lambdas don't support move) and
    // use a weak ptr in the caller.
    callback = [&resp] {
      resp.Resolve(ipc::AsyncResult<protos::gen::CommitDataResponse>::Create());
    };
  }
  producer->service_endpoint->CommitData(req, callback);
}